

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode *node)

{
  byte bVar1;
  ImGuiDockNode *pIVar2;
  ImGuiWindow *window;
  bool bVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  pIVar4 = GImGui;
  pIVar2 = node->ParentNode;
  if (pIVar2 != (ImGuiDockNode *)0x0) {
    if ((pIVar2->ChildNodes[0] != node) && (pIVar2->ChildNodes[1] != node)) {
      __assert_fail("node->ParentNode == __null || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x320d,
                    "void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode *)");
    }
    if (pIVar2 != (ImGuiDockNode *)0x0) {
      node->SharedFlags = pIVar2->SharedFlags;
    }
  }
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[0]);
  }
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[1]);
  }
  if (0 < (node->Windows).Size) {
    uVar6 = 0;
    do {
      if ((int)uVar6 < 0) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                      ,0x5c2,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (node->Windows).Data[uVar6];
      if (window->DockNode != node) {
        __assert_fail("window->DockNode == node",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3221,
                      "void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode *)");
      }
      bVar3 = false;
      bVar7 = false;
      if ((node->LastFrameActive + 1 == pIVar4->FrameCount) &&
         (((bVar3 = window->LastFrameActive + 1 < pIVar4->FrameCount, bVar7 = false,
           (node->field_0xb9 & 0x40) != 0 || (node->WantCloseTabId == window->ID)) &&
          (window->HasCloseButton == true)))) {
        bVar7 = (window->Flags & 0x100000) == 0;
      }
      if ((bVar7 || bVar3) || ((byte)window->field_0x492 >> 2 & 1) != 0) {
        window->field_0x492 = window->field_0x492 & 0xfb;
        if (((node->Windows).Size != 1) || ((node->LocalFlags & 0x800) != 0)) {
          DockNodeRemoveWindow(node,window,node->ID);
          uVar6 = uVar6 - 1;
          goto LAB_00145630;
        }
        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        DockNodeRemoveWindow(node,window,node->ID);
        bVar3 = false;
      }
      else {
        uVar5 = ~(window->WindowClass).DockNodeFlagsOverrideClear & node->LocalFlags;
        node->LocalFlags = uVar5;
        node->LocalFlags = uVar5 | (window->WindowClass).DockNodeFlagsOverrideSet;
LAB_00145630:
        bVar3 = true;
      }
      if (!bVar3) {
        return;
      }
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < (node->Windows).Size);
  }
  uVar6 = node->LocalFlags;
  if (((node->field_0xba & 2) != 0) &&
     (((uVar6 & 0x2000) == 0 && (node->Windows).Size == 1) &&
      ((node->SharedFlags | uVar6) & 0x40) != 0)) {
    node->field_0xba = node->field_0xba | 4;
  }
  bVar1 = node->field_0xba;
  node->field_0xba = bVar1 & 0xfd;
  if ((((bVar1 & 4) != 0) && (node->VisibleWindow != (ImGuiWindow *)0x0)) &&
     (((node->VisibleWindow->WindowClass).DockNodeFlagsOverrideSet & 0x2000) != 0)) {
    node->field_0xba = bVar1 & 0xf9;
  }
  if ((node->Windows).Size < 2) {
    if ((node->field_0xba & 4) == 0) goto LAB_001456cf;
    uVar6 = uVar6 ^ 0x2000;
  }
  else {
    uVar6 = uVar6 & 0xffffdfff;
  }
  node->LocalFlags = uVar6;
LAB_001456cf:
  node->field_0xba = node->field_0xba & 0xfb;
  DockNodeUpdateVisibleFlag(node);
  return;
}

Assistant:

static void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->ParentNode == NULL || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node);

    // Inherit most flags
    if (node->ParentNode)
        node->SharedFlags = node->ParentNode->SharedFlags & ImGuiDockNodeFlags_SharedFlagsInheritMask_;

    // Recurse into children
    // There is the possibility that one of our child becoming empty will delete itself and moving its sibling contents into 'node'.
    // If 'node->ChildNode[0]' delete itself, then 'node->ChildNode[1]->Windows' will be moved into 'node'
    // If 'node->ChildNode[1]' delete itself, then 'node->ChildNode[0]->Windows' will be moved into 'node' and the "remove inactive windows" loop will have run twice on those windows (harmless)
    if (node->ChildNodes[0])
        DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[1]);

    // Remove inactive windows
    // Merge node flags overrides stored in windows
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        ImGuiWindow* window = node->Windows[window_n];
        IM_ASSERT(window->DockNode == node);

        bool node_was_active = (node->LastFrameActive + 1 == g.FrameCount);
        bool remove = false;
        remove |= node_was_active && (window->LastFrameActive + 1 < g.FrameCount);
        remove |= node_was_active && (node->WantCloseAll || node->WantCloseTabId == window->ID) && window->HasCloseButton && !(window->Flags & ImGuiWindowFlags_UnsavedDocument);  // Submit all _expected_ closure from last frame
        remove |= (window->DockTabWantClose);
        if (remove)
        {
            window->DockTabWantClose = false;
            if (node->Windows.Size == 1 && !node->IsCentralNode())
            {
                DockNodeHideHostWindow(node);
                node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
                DockNodeRemoveWindow(node, window, node->ID); // Will delete the node so it'll be invalid on return
                return;
            }
            DockNodeRemoveWindow(node, window, node->ID);
            window_n--;
        }
        else
        {
            node->LocalFlags &= ~window->WindowClass.DockNodeFlagsOverrideClear;
            node->LocalFlags |= window->WindowClass.DockNodeFlagsOverrideSet;
        }
    }

    // Auto-hide tab bar option
    ImGuiDockNodeFlags node_flags = node->GetMergedFlags();
    if (node->WantHiddenTabBarUpdate && node->Windows.Size == 1 && (node_flags & ImGuiDockNodeFlags_AutoHideTabBar) && !node->IsHiddenTabBar())
        node->WantHiddenTabBarToggle = true;
    node->WantHiddenTabBarUpdate = false;

    // Cancel toggling if we know our tab bar is enforced to be hidden at all times
    if (node->WantHiddenTabBarToggle && node->VisibleWindow && (node->VisibleWindow->WindowClass.DockNodeFlagsOverrideSet & ImGuiDockNodeFlags_HiddenTabBar))
        node->WantHiddenTabBarToggle = false;

    // Apply toggles at a single point of the frame (here!)
    if (node->Windows.Size > 1)
        node->LocalFlags &= ~ImGuiDockNodeFlags_HiddenTabBar;
    else if (node->WantHiddenTabBarToggle)
        node->LocalFlags ^= ImGuiDockNodeFlags_HiddenTabBar;
    node->WantHiddenTabBarToggle = false;

    DockNodeUpdateVisibleFlag(node);
}